

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O2

Scal __thiscall LinearExpert<1,_1>::queryZ(LinearExpert<1,_1> *this,Z *z)

{
  ulong uVar1;
  double dVar2;
  type tVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Z dzAux;
  double local_48;
  Z *local_40;
  Z *local_38;
  Scal local_28;
  
  dVar2 = (z->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.array
          [0] - (this->Nu).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
                m_data.array[0];
  (this->dz).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0]
       = dVar2;
  (this->pred_x).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (this->Lambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data
        .array[0] * dVar2 +
        (this->Mu).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.
        array[0];
  dVar5 = this->wSigma + this->Sh;
  dVar6 = dVar5 + -1.0 + 1.0;
  dVar4 = this->Sh + this->wNu;
  uVar1 = -(ulong)(this->wNu == 0.0);
  dVar7 = ((double)(~uVar1 & 0x4000000000000000 | uVar1 & 0x3ff0000000000000) + dVar5 + 1.0) *
          ((dVar4 + 1.0) / dVar4);
  dVar5 = (this->invSigma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0] * dVar2;
  dVar2 = dVar2 * dVar5;
  this->dz_invSigma_dz = dVar2;
  dVar2 = dVar2 / dVar7 + 1.0;
  dVar4 = dVar6 + 1.0;
  (this->kappa).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = ((dVar4 / dVar7) / dVar2) * dVar5;
  dVar2 = pow(dVar2,dVar4 * -0.5);
  this->rbf_z = dVar2;
  dVar2 = this->sqrtDetInvSigma;
  tVar3 = boost::math::tgamma_delta_ratio<double,double>(dVar6 * 0.5,0.5);
  dVar4 = pow(2.0 / dVar7,0.5);
  this->p_z_T = dVar4 * (dVar2 / tVar3) * this->rbf_z;
  local_38 = &this->Sz;
  local_28 = this->Sh;
  local_40 = z;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,1,0,1,1>const>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,1,1,0,1,1>> *)&local_48,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>_>
              *)&local_40);
  dVar2 = (this->varLambda).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
          m_data.array[0] * local_48;
  this->gamma = local_48 * dVar2 + 1.0 / this->Sh;
  (this->dGamma).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = dVar2 + dVar2;
  return this->p_z_T;
}

Assistant:

EXPERT_CLASS_TEMPLATE
Scal LINEAR_EXPERT_base::queryZ( Z const &z )
{
    dz = z - Nu;
    pred_x = Lambda * dz + Mu;

    Scal dof = wSigma + Sh - d + 1.0;
    Scal aux1 = (wNu + Sh + 1.0) / (wNu + Sh) * (wSigma + Sh + d + (wNu == 0.0 ? 1.0 : 2.0));

    Z aux2 = invSigma * dz;
    dz_invSigma_dz = dz.dot( aux2 );
    Scal aux3 = 1.0 + dz_invSigma_dz / aux1;
    kappa = ( (dof+d)/aux1/aux3 ) * aux2;

    rbf_z = pow(aux3 , -0.5*(dof+d) );
    p_z_T = sqrtDetInvSigma / boost::math::tgamma_delta_ratio(0.5*dof, 0.5*d) * pow(2.0/aux1, 0.5*d) * rbf_z;

    Z dzAux = z - Sz/Sh;
    dGamma = varLambda * dzAux;
    gamma = 1.0/Sh + dzAux.dot( dGamma );
    dGamma *= 2.0;

    return p_z_T;
}